

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O2

Gia_Man_t * Gia_ManTransformFlops(Gia_Man_t *p,Vec_Int_t *vFlops,Vec_Int_t *vInit)

{
  int iVar1;
  int *pInitState;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar2;
  uint uVar3;
  size_t __size;
  int i;
  int iVar4;
  
  iVar1 = vInit->nSize;
  if (iVar1 != vFlops->nSize) {
    __assert_fail("Vec_IntSize(vInit) == Vec_IntSize(vFlops)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOut.c"
                  ,0x15a,"Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  i = 0;
  iVar4 = ((p->nRegs >> 5) + 1) - (uint)((p->nRegs & 0x1fU) == 0);
  if (iVar4 == 0) {
    __size = 0;
    pInitState = (int *)0x0;
  }
  else {
    __size = (long)iVar4 << 2;
    pInitState = (int *)malloc(__size);
  }
  memset(pInitState,0,__size);
  for (; i < iVar1; i = i + 1) {
    iVar1 = Vec_IntEntry(vFlops,i);
    pObj = Gia_ManObj(p,iVar1);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjIsRo(p,pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOut.c"
                    ,0x15e,"Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Vec_IntEntry(vInit,i);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjCioId(pObj);
      uVar3 = (p->nRegs - p->vCis->nSize) + iVar1;
      if (((int)uVar3 < 0) || (p->nRegs <= (int)uVar3)) {
        __assert_fail("iFlopId >= 0 && iFlopId < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOut.c"
                      ,0x162,
                      "Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar4 * 0x20 <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      pInitState[uVar3 >> 5] = pInitState[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
    }
    iVar1 = vFlops->nSize;
  }
  pGVar2 = Gia_ManDupFlip(p,pInitState);
  free(pInitState);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManTransformFlops( Gia_Man_t * p, Vec_Int_t * vFlops, Vec_Int_t * vInit )
{
    Vec_Bit_t * vInitNew;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iFlopId;
    assert( Vec_IntSize(vInit) == Vec_IntSize(vFlops) );
    vInitNew = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
    {
        assert( Gia_ObjIsRo(p, pObj) );
        if ( Vec_IntEntry(vInit, i) == 0 )
            continue;
        iFlopId = Gia_ObjCioId(pObj) - Gia_ManPiNum(p);
        assert( iFlopId >= 0 && iFlopId < Gia_ManRegNum(p) );
        Vec_BitWriteEntry( vInitNew, iFlopId, 1 );
    }
    pNew = Gia_ManDupFlip( p, Vec_BitArray(vInitNew) );
    Vec_BitFree( vInitNew );
    return pNew;
}